

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_assertion_handler.hpp
# Opt level: O2

void __thiscall
Catch::AssertionHandler::handleExpr<slang::logic_t&>
          (AssertionHandler *this,ExprLhs<slang::logic_t_&> *expr)

{
  UnaryExpr<slang::logic_t_&> UStack_28;
  
  ExprLhs<slang::logic_t_&>::makeUnaryExpr(&UStack_28,expr);
  handleExpr(this,&UStack_28.super_ITransientExpression);
  return;
}

Assistant:

constexpr void handleExpr( ExprLhs<T> const& expr ) {
            handleExpr( expr.makeUnaryExpr() );
        }